

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_impl.hpp
# Opt level: O1

void __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::Node::~Node(Node *this)

{
  Term *this_00;
  
  this->_vptr_Node = (_func_int **)&PTR__Node_00b59b60;
  this_00 = (Term *)(this->_term)._content;
  if (((ulong)this_00 & 3) == 0) {
    Kernel::Term::destroyNonShared(this_00);
  }
  return;
}

Assistant:

SubstitutionTree<LeafData_>::Node::~Node()
{
  if(term().isTerm()) {
    term().term()->destroyNonShared();
  }
}